

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTabButton::doAction(QAccessibleTabButton *this,QString *actionName)

{
  bool bVar1;
  ulong uVar2;
  QString *in_RSI;
  QTabBar *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  QString *pQVar3;
  int index;
  
  uVar2 = (**(code **)(*(long *)&in_RDI->super_QWidget + 0x10))();
  if ((uVar2 & 1) != 0) {
    pQVar3 = in_RSI;
    QAccessibleActionInterface::pressAction();
    index = (int)((ulong)pQVar3 >> 0x20);
    bVar1 = ::operator==(in_RSI,in_stack_ffffffffffffffd8);
    if (bVar1) {
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d72b8);
      QTabBar::setCurrentIndex(in_RDI,index);
    }
  }
  return;
}

Assistant:

void doAction(const QString &actionName) override
    {
        if (isValid() && actionName == pressAction())
            m_parent->setCurrentIndex(m_index);
    }